

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::IsLocked(CWallet *this)

{
  long in_FS_OFFSET;
  bool bVar1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock63;
  unique_lock<std::recursive_mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar1 = false;
  }
  else {
    local_20._M_device = &(this->cs_wallet).super_recursive_mutex;
    local_20._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_20);
    bVar1 = (this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::IsLocked() const
{
    if (!IsCrypted()) {
        return false;
    }
    LOCK(cs_wallet);
    return vMasterKey.empty();
}